

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O1

void __thiscall node::BlockManager::CleanupBlockRevFiles(BlockManager *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  size_type sVar3;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var4;
  path path_00;
  char cVar5;
  int iVar6;
  int iVar7;
  path *ppVar8;
  long lVar9;
  mapped_type *this_00;
  _Base_ptr p_Var10;
  long in_FS_OFFSET;
  bool bVar11;
  string_view source_file;
  string_view logging_function;
  string_view str;
  undefined1 auStack_168 [8];
  directory_iterator it;
  undefined1 local_150 [3] [16];
  path local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  path local_d8;
  path local_b0;
  string path;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
  mapBlockFiles;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  mapBlockFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &mapBlockFiles._M_t._M_impl.super__Rb_tree_header._M_header;
  mapBlockFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mapBlockFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  mapBlockFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
  ;
  source_file._M_len = 0x65;
  logging_function._M_str = "CleanupBlockRevFiles";
  logging_function._M_len = 0x14;
  mapBlockFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       mapBlockFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  LogPrintFormatInternal<>
            (logging_function,source_file,0x27c,ALL,Info,(ConstevalFormatString<0U>)0xfa0750);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            (&it,&(this->m_opts).blocks_dir.super_path,none,(error_code *)0x0);
  if (it._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    do {
      ppVar8 = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&it);
      sVar3 = (ppVar8->_M_pathname)._M_string_length;
      if (sVar3 == 0) {
LAB_00925975:
        std::filesystem::__cxx11::path::path(&local_d8);
      }
      else {
        _Var4._M_head_impl =
             (ppVar8->_M_cmpts)._M_impl._M_t.
             super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
             ._M_t.
             super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
             .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
             _M_head_impl;
        if ((~(byte)_Var4._M_head_impl & 3) != 0) {
          if ((((ulong)_Var4._M_head_impl & 3) == 0) &&
             ((ppVar8->_M_pathname)._M_dataplus._M_p[sVar3 - 1] != '/')) {
            if (((ulong)_Var4._M_head_impl & 3) == 0) {
              lVar9 = std::filesystem::__cxx11::path::_List::end();
            }
            else {
              lVar9 = 0;
            }
            if ((*(byte *)&(ppVar8->_M_cmpts)._M_impl._M_t.
                           super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                           .
                           super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                           ._M_head_impl & 3) == 0) {
              ppVar8 = (path *)(lVar9 + -0x30);
            }
            if ((~*(uint *)&(ppVar8->_M_cmpts)._M_impl._M_t.
                            super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                            .
                            super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                            ._M_head_impl & 3) == 0) goto LAB_00925968;
          }
          goto LAB_00925975;
        }
LAB_00925968:
        std::filesystem::__cxx11::path::path(&local_d8,ppVar8);
      }
      std::filesystem::__cxx11::path::path(&local_b0,&local_d8);
      path._M_dataplus._M_p = (pointer)&path.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&path,local_b0._M_pathname._M_dataplus._M_p,
                 local_b0._M_pathname._M_dataplus._M_p + local_b0._M_pathname._M_string_length);
      std::filesystem::__cxx11::path::~path(&local_b0);
      std::filesystem::__cxx11::path::~path(&local_d8);
      ppVar8 = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&it);
      cVar5 = std::filesystem::status(ppVar8);
      if (path._M_string_length == 0xc && cVar5 == '\x01') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_f8,&path,8,4);
        iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_f8,".dat");
        bVar11 = iVar6 == 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar11 = false;
      }
      if (bVar11) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_b0._M_pathname,&path,0,3);
        iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_b0._M_pathname,"blk");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_pathname._M_dataplus._M_p != &local_b0._M_pathname.field_2) {
          operator_delete(local_b0._M_pathname._M_dataplus._M_p,
                          local_b0._M_pathname.field_2._M_allocated_capacity + 1);
        }
        if (iVar6 == 0) {
          ppVar8 = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&it);
          std::filesystem::__cxx11::path::path(&local_120,ppVar8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_b0._M_pathname,&path,3,5);
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
                    ::operator[](&mapBlockFiles,&local_b0._M_pathname);
          path_00._M_pathname.field_2._M_allocated_capacity = (size_type)it._M_dir._M_refcount._M_pi
          ;
          path_00._M_pathname._0_16_ = _auStack_168;
          path_00._24_16_ = local_150[0];
          fs::path::operator=(this_00,path_00);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_pathname._M_dataplus._M_p != &local_b0._M_pathname.field_2) {
            operator_delete(local_b0._M_pathname._M_dataplus._M_p,
                            local_b0._M_pathname.field_2._M_allocated_capacity + 1);
          }
          std::filesystem::__cxx11::path::~path(&local_120);
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_b0._M_pathname,&path,0,3);
          iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_b0._M_pathname,"rev");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_pathname._M_dataplus._M_p != &local_b0._M_pathname.field_2) {
            operator_delete(local_b0._M_pathname._M_dataplus._M_p,
                            local_b0._M_pathname.field_2._M_allocated_capacity + 1);
          }
          if (iVar6 == 0) {
            ppVar8 = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&it);
            std::filesystem::remove(ppVar8);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)path._M_dataplus._M_p != &path.field_2) {
        operator_delete(path._M_dataplus._M_p,path.field_2._M_allocated_capacity + 1);
      }
      std::filesystem::__cxx11::directory_iterator::operator++
                ((__directory_iterator_proxy *)local_150,&it,0);
      std::filesystem::__cxx11::path::~path((path *)local_150);
    } while (it._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0);
  }
  if (it._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(it._M_dir._M_refcount._M_pi);
  }
  p_Var1 = &mapBlockFiles._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)mapBlockFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      p_Var1) {
    iVar6 = 0;
    p_Var10 = mapBlockFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      str._M_str = *(char **)(p_Var10 + 1);
      str._M_len = (size_t)p_Var10[1]._M_parent;
      iVar7 = LocaleIndependentAtoi<int>(str);
      if (iVar7 == iVar6) {
        iVar6 = iVar6 + 1;
      }
      else {
        std::filesystem::remove((path *)(p_Var10 + 2));
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while ((_Rb_tree_header *)p_Var10 != p_Var1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
  ::~_Rb_tree(&mapBlockFiles._M_t);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BlockManager::CleanupBlockRevFiles() const
{
    std::map<std::string, fs::path> mapBlockFiles;

    // Glob all blk?????.dat and rev?????.dat files from the blocks directory.
    // Remove the rev files immediately and insert the blk file paths into an
    // ordered map keyed by block file index.
    LogPrintf("Removing unusable blk?????.dat and rev?????.dat files for -reindex with -prune\n");
    for (fs::directory_iterator it(m_opts.blocks_dir); it != fs::directory_iterator(); it++) {
        const std::string path = fs::PathToString(it->path().filename());
        if (fs::is_regular_file(*it) &&
            path.length() == 12 &&
            path.substr(8,4) == ".dat")
        {
            if (path.substr(0, 3) == "blk") {
                mapBlockFiles[path.substr(3, 5)] = it->path();
            } else if (path.substr(0, 3) == "rev") {
                remove(it->path());
            }
        }
    }

    // Remove all block files that aren't part of a contiguous set starting at
    // zero by walking the ordered map (keys are block file indices) by
    // keeping a separate counter.  Once we hit a gap (or if 0 doesn't exist)
    // start removing block files.
    int nContigCounter = 0;
    for (const std::pair<const std::string, fs::path>& item : mapBlockFiles) {
        if (LocaleIndependentAtoi<int>(item.first) == nContigCounter) {
            nContigCounter++;
            continue;
        }
        remove(item.second);
    }
}